

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

void __thiscall
icu_63::CollationIterator::backwardNumSkipped
          (CollationIterator *this,int32_t n,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  int32_t n_local;
  CollationIterator *this_local;
  
  errorCode_local._4_4_ = n;
  if (this->skipped != (SkippedState *)0x0) {
    UVar1 = SkippedState::isEmpty(this->skipped);
    if (UVar1 == '\0') {
      errorCode_local._4_4_ = SkippedState::backwardNumCodePoints(this->skipped,n);
    }
  }
  (*(this->super_UObject)._vptr_UObject[0xd])(this,(ulong)errorCode_local._4_4_,errorCode);
  if (-1 < this->numCpFwd) {
    this->numCpFwd = errorCode_local._4_4_ + this->numCpFwd;
  }
  return;
}

Assistant:

void
CollationIterator::backwardNumSkipped(int32_t n, UErrorCode &errorCode) {
    if(skipped != NULL && !skipped->isEmpty()) {
        n = skipped->backwardNumCodePoints(n);
    }
    backwardNumCodePoints(n, errorCode);
    if(numCpFwd >= 0) { numCpFwd += n; }
}